

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O2

Result __thiscall wabt::TypeChecker::OnBrIf(TypeChecker *this,Index depth)

{
  Result RVar1;
  Result RVar2;
  Label *in_RAX;
  TypeVector *pTVar3;
  Enum EVar4;
  Label *local_38;
  Label *label;
  
  local_38 = in_RAX;
  RVar1 = PopAndCheck1Type(this,I32,"br_if");
  RVar2 = GetLabel(this,depth,&local_38);
  if (RVar2.enum_ == Error) {
    EVar4 = Error;
  }
  else {
    pTVar3 = &local_38->result_types;
    if (local_38->label_type == Loop) {
      pTVar3 = &local_38->param_types;
    }
    RVar2 = PopAndCheckSignature(this,pTVar3,"br_if");
    EVar4 = (Enum)(RVar2.enum_ == Error || RVar1.enum_ == Error);
    pTVar3 = &local_38->result_types;
    if (local_38->label_type == Loop) {
      pTVar3 = &local_38->param_types;
    }
    PushTypes(this,pTVar3);
  }
  return (Result)EVar4;
}

Assistant:

Result TypeChecker::OnBrIf(Index depth) {
  Result result = PopAndCheck1Type(Type::I32, "br_if");
  Label* label;
  CHECK_RESULT(GetLabel(depth, &label));
  result |= PopAndCheckSignature(label->br_types(), "br_if");
  PushTypes(label->br_types());
  return result;
}